

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetField<bool>
          (Reflection *this,Message *message,FieldDescriptor *field,bool *value)

{
  byte bVar1;
  bool bVar2;
  OneofDescriptor *pOVar3;
  bool *pbVar4;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  FieldDescriptor *in_RDX;
  Reflection *in_RSI;
  Message *in_RDI;
  OneofDescriptor *unaff_retaddr;
  Message *in_stack_00000008;
  Reflection *in_stack_00000010;
  FieldDescriptor *in_stack_00000040;
  Message *in_stack_00000048;
  Reflection *in_stack_00000050;
  Reflection *in_stack_ffffffffffffffd0;
  Reflection *this_00;
  Reflection *this_01;
  
  this_00 = (Reflection *)CONCAT71(in_register_00000009,in_CL);
  pOVar3 = FieldDescriptor::containing_oneof(in_RDX);
  this_01 = in_RSI;
  if (pOVar3 != (OneofDescriptor *)0x0) {
    bVar2 = HasOneofField(in_RSI,(Message *)in_RDX,(FieldDescriptor *)this_00);
    this_01 = in_RSI;
    if (!bVar2) {
      FieldDescriptor::containing_oneof(in_RDX);
      ClearOneof(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      in_stack_ffffffffffffffd0 = in_RSI;
    }
  }
  bVar1 = *(byte *)&this_00->descriptor_;
  pbVar4 = MutableRaw<bool>(this_00,in_RDI,(FieldDescriptor *)in_stack_ffffffffffffffd0);
  *pbVar4 = (bool)(bVar1 & 1);
  pOVar3 = FieldDescriptor::containing_oneof(in_RDX);
  if (pOVar3 == (OneofDescriptor *)0x0) {
    SetBit(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  }
  else {
    SetOneofCase(this_01,(Message *)in_RDX,(FieldDescriptor *)this_00);
  }
  return;
}

Assistant:

void Reflection::SetField(Message* message, const FieldDescriptor* field,
                          const Type& value) const {
  if (field->containing_oneof() && !HasOneofField(*message, field)) {
    ClearOneof(message, field->containing_oneof());
  }
  *MutableRaw<Type>(message, field) = value;
  field->containing_oneof() ? SetOneofCase(message, field)
                            : SetBit(message, field);
}